

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512-sw.c
# Opt level: O0

void sha512_sw_write(BinarySink *bs,void *vp,size_t len)

{
  _Bool _Var1;
  sha512_sw *s;
  size_t len_local;
  void *vp_local;
  BinarySink *bs_local;
  
  s = (sha512_sw *)len;
  len_local = (size_t)vp;
  vp_local = bs;
  while (s != (sha512_sw *)0x0) {
    _Var1 = sha512_block_write((sha512_block *)&bs[-7].binarysink_,(void **)&len_local,(size_t *)&s)
    ;
    if (_Var1) {
      sha512_sw_block((uint64_t *)(bs + -9),(uint8_t *)&bs[-7].binarysink_);
    }
  }
  return;
}

Assistant:

static void sha512_sw_write(BinarySink *bs, const void *vp, size_t len)
{
    sha512_sw *s = BinarySink_DOWNCAST(bs, sha512_sw);

    while (len > 0)
        if (sha512_block_write(&s->blk, &vp, &len))
            sha512_sw_block(s->core, s->blk.block);
}